

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinChar
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  pointer pcVar1;
  RuntimeError *pRVar2;
  allocator_type *in_RCX;
  long lVar3;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  Value VVar4;
  stringstream ss;
  string local_1e8;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_1c8;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  local_1a0 [23];
  
  pcVar1 = (pointer)(local_1b0 + 0x10);
  local_1b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"char","");
  local_1e8._M_dataplus._M_p._0_4_ = 2;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_1e8;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector(&local_1c8,__l,in_RCX);
  validateBuiltinArgs(this,loc,(string *)local_1b0,args,&local_1c8);
  if (local_1c8.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.
                    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_1b0._0_8_ != pcVar1) {
    operator_delete((void *)local_1b0._0_8_,
                    CONCAT44(local_1a0[0]._M_local_buf[1],local_1a0[0]._M_local_buf[0]) + 1);
  }
  lVar3 = (long)(((args->
                  super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                  )._M_impl.super__Vector_impl_data._M_start)->v).d;
  if (-1 < lVar3) {
    if (lVar3 < 0x110000) {
      local_1a0[0]._0_4_ = (undefined4)lVar3;
      local_1b0._8_8_ = 1;
      local_1a0[0]._M_local_buf[1] = L'\0';
      local_1b0._0_8_ = pcVar1;
      VVar4 = makeString(this,(UString *)local_1b0);
      (this->scratch).t = STRING;
      (this->scratch).v = VVar4._0_8_;
      if ((pointer)local_1b0._0_8_ != pcVar1) {
        operator_delete((void *)local_1b0._0_8_,
                        CONCAT44(local_1a0[0]._M_local_buf[1],local_1a0[0]._M_local_buf[0]) * 4 + 4)
        ;
      }
      return (AST *)0x0;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 0x10),"invalid unicode codepoint, got ",0x1f);
    std::ostream::_M_insert<long>((long)(local_1b0 + 0x10));
    pRVar2 = (RuntimeError *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    Stack::makeError(pRVar2,&this->stack,loc,&local_1e8);
    __cxa_throw(pRVar2,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b0 + 0x10),"codepoints must be >= 0, got ",0x1d);
  std::ostream::_M_insert<long>((long)(local_1b0 + 0x10));
  pRVar2 = (RuntimeError *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  Stack::makeError(pRVar2,&this->stack,loc,&local_1e8);
  __cxa_throw(pRVar2,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

const AST *builtinChar(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "char", args, {Value::NUMBER});
        long l = long(args[0].v.d);
        if (l < 0) {
            std::stringstream ss;
            ss << "codepoints must be >= 0, got " << l;
            throw makeError(loc, ss.str());
        }
        if (l >= JSONNET_CODEPOINT_MAX) {
            std::stringstream ss;
            ss << "invalid unicode codepoint, got " << l;
            throw makeError(loc, ss.str());
        }
        char32_t c = l;
        scratch = makeString(UString(&c, 1));
        return nullptr;
    }